

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

MPP_RET mpp_trie_check(MppTrie trie,char *log)

{
  long lVar1;
  MPP_RET in_EAX;
  MPP_RET extraout_EAX;
  MppTrieNode *pMVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *name;
  
  if (0 < *(int *)((long)trie + 0x18)) {
    lVar1 = *(long *)((long)trie + 0x40);
    lVar3 = 0x10;
    uVar5 = 0;
    do {
      name = (char *)(*(int *)(*(long *)((long)trie + 0x20) + lVar3) + lVar1);
      pMVar2 = mpp_trie_get_node(*(MppTrieNode **)((long)trie + 0x30),name);
      if (pMVar2 == (MppTrieNode *)0x0) {
        uVar4 = 0xffffffff;
LAB_0013a6b5:
        _mpp_log_l(2,"mpp_trie","trie check on %s found mismatch info %s %d - %d\n",(char *)0x0,log,
                   name,uVar5,uVar4);
        return extraout_EAX;
      }
      uVar4 = (ulong)(uint)pMVar2->id;
      if ((pMVar2->id < 0) || (uVar5 != uVar4)) goto LAB_0013a6b5;
      uVar5 = uVar5 + 1;
      in_EAX = *(MPP_RET *)((long)trie + 0x18);
      lVar3 = lVar3 + 0x14;
    } while ((long)uVar5 < (long)in_EAX);
  }
  return in_EAX;
}

Assistant:

static MPP_RET mpp_trie_check(MppTrie trie, const char *log)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    char *buf = (char *)p->name_buf;
    RK_S32 i;

    for (i = 0; i < p->info_used; i++) {
        const char *name = buf + p->info[i].name_offset;
        MppTrieNode *node = mpp_trie_get_node(p->nodes, name);

        if (node && node->id >= 0 && node->id == i)
            continue;

        mpp_loge("trie check on %s found mismatch info %s %d - %d\n",
                 log, name, i, node ? node->id : -1);
        return MPP_NOK;
    }

    return MPP_OK;
}